

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateVkImpl::InitPipelineLayout
          (PipelineStateVkImpl *this,PipelineStateCreateInfo *CreateInfo,TShaderStages *ShaderStages
          )

{
  byte bVar1;
  PSO_CREATE_FLAGS PVar2;
  Uint32 UVar3;
  RenderDeviceVkImpl *pDeviceVk;
  char (*Args_1) [16];
  uint uVar4;
  ulong uVar5;
  char local_139;
  string msg;
  PipelineResourceSignatureDescWrapper SignDesc;
  
  if ((uint *)CreateInfo->pInternalData == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *CreateInfo->pInternalData;
  }
  if (((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_UsingImplicitSignature ==
       true) && ((uVar4 & 1) == 0)) {
    GetDefaultResourceSignatureDesc
              (&SignDesc,ShaderStages,
               (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,
               &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                .m_Desc.ResourceLayout,
               (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
               .m_Desc.SRBAllocationGranularity);
    msg._M_dataplus._M_p._0_4_ =
         (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_ActiveShaderStages;
    Args_1 = (char (*) [16])&local_139;
    local_139 = '\0';
    PipelineStateBase<Diligent::EngineVkImplTraits>::
    InitDefaultSignature<Diligent::SHADER_TYPE,bool>
              (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,&SignDesc.m_Desc,
               (SHADER_TYPE *)&msg,(bool *)Args_1);
    if (((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_Signatures)->m_pObject ==
        (PipelineResourceSignatureVkImpl *)0x0) {
      FormatString<char[26],char[16]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_Signatures[0]",
                 Args_1);
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(SHADER_TYPE)msg._M_dataplus._M_p),
                 "InitPipelineLayout",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x31a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(msg._M_dataplus._M_p._4_4_,(SHADER_TYPE)msg._M_dataplus._M_p) != &msg.field_2)
      {
        operator_delete((undefined1 *)
                        CONCAT44(msg._M_dataplus._M_p._4_4_,(SHADER_TYPE)msg._M_dataplus._M_p),
                        msg.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&SignDesc.m_StringPool._M_h);
    if (SignDesc.m_ImmutableSamplers.
        super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(SignDesc.m_ImmutableSamplers.
                      super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)SignDesc.m_ImmutableSamplers.
                            super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)SignDesc.m_ImmutableSamplers.
                            super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (SignDesc.m_Resources.
        super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(SignDesc.m_Resources.
                      super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)SignDesc.m_Resources.
                            super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)SignDesc.m_Resources.
                            super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)SignDesc.m_CombinedSamplerSuffix._M_dataplus._M_p !=
        &SignDesc.m_CombinedSamplerSuffix.field_2) {
      operator_delete(SignDesc.m_CombinedSamplerSuffix._M_dataplus._M_p,
                      SignDesc.m_CombinedSamplerSuffix.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)SignDesc.m_Name._M_dataplus._M_p != &SignDesc.m_Name.field_2) {
      operator_delete(SignDesc.m_Name._M_dataplus._M_p,
                      SignDesc.m_Name.field_2._M_allocated_capacity + 1);
    }
  }
  DvpValidateResourceLimits(this);
  pDeviceVk = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                           *)this);
  PipelineLayoutVk::Create
            (&this->m_PipelineLayout,pDeviceVk,
             (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_Signatures,
             (uint)(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount);
  PVar2 = CreateInfo->Flags;
  if (((PVar2 & PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES) == PSO_CREATE_FLAG_NONE) ||
     ((uVar4 & 2) == 0)) {
    SignDesc.m_Name.field_2._M_allocated_capacity = 0;
    SignDesc.m_Name.field_2._8_8_ = 0;
    SignDesc.m_Name._M_dataplus._M_p = (pointer)0x0;
    SignDesc.m_Name._M_string_length = 0;
    if ((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount == '\0') {
      UVar3 = 0;
    }
    else {
      uVar5 = 0;
      do {
        UVar3 = PipelineLayoutVk::GetFirstDescrSetIndex(&this->m_PipelineLayout,(Uint32)uVar5);
        *(Uint32 *)((long)&SignDesc.m_Name._M_dataplus._M_p + uVar5 * 4) = UVar3;
        uVar5 = uVar5 + 1;
        bVar1 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_SignatureCount;
        UVar3 = (Uint32)bVar1;
      } while (uVar5 < bVar1);
    }
    RemapOrVerifyShaderResources
              (ShaderStages,
               (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).m_Signatures,UVar3,
               (TBindIndexToDescSetIndex *)&SignDesc,
               SUB41((PVar2 & PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES) >> 2,0),true,
               (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,&this->m_ShaderResources,
               &this->m_ResourceAttibutions);
  }
  return;
}

Assistant:

void PipelineStateVkImpl::InitPipelineLayout(const PipelineStateCreateInfo& CreateInfo, TShaderStages& ShaderStages) noexcept(false)
{
    const PSO_CREATE_INTERNAL_FLAGS InternalFlags = GetInternalCreateFlags(CreateInfo);
    if (m_UsingImplicitSignature && (InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
    {
        const PipelineResourceSignatureDescWrapper SignDesc = GetDefaultResourceSignatureDesc(ShaderStages, m_Desc.Name, m_Desc.ResourceLayout, m_Desc.SRBAllocationGranularity);
        InitDefaultSignature(SignDesc, GetActiveShaderStages(), false /*bIsDeviceInternal*/);
        VERIFY_EXPR(m_Signatures[0]);
    }

#ifdef DILIGENT_DEVELOPMENT
    DvpValidateResourceLimits();
#endif

    m_PipelineLayout.Create(GetDevice(), m_Signatures, m_SignatureCount);

    const bool RemapResources = (CreateInfo.Flags & PSO_CREATE_FLAG_DONT_REMAP_SHADER_RESOURCES) == 0;
    const bool VerifyBindings = !RemapResources && ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION) == 0);
    if (RemapResources || VerifyBindings)
    {
        VERIFY_EXPR(RemapResources ^ VerifyBindings);
        TBindIndexToDescSetIndex BindIndexToDescSetIndex = {};
        for (Uint32 i = 0; i < m_SignatureCount; ++i)
            BindIndexToDescSetIndex[i] = m_PipelineLayout.GetFirstDescrSetIndex(i);

        // Note that we always need to strip reflection information when it is present
        RemapOrVerifyShaderResources(ShaderStages,
                                     m_Signatures,
                                     m_SignatureCount,
                                     BindIndexToDescSetIndex,
                                     VerifyBindings, // VerifyOnly
                                     true,           // bStripReflection
                                     m_Desc.Name,
#ifdef DILIGENT_DEVELOPMENT
                                     &m_ShaderResources, &m_ResourceAttibutions
#else
                                     nullptr, nullptr
#endif
        );
    }
}